

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

double __thiscall
alex::
AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
compute_expected_cost
          (AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,double frac_inserts)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ExpectedShiftsAccumulator shifts_accumulator;
  const_iterator_type it;
  ExpectedSearchIterationsAccumulator search_iters_accumulator;
  
  if (this->num_keys_ != 0) {
    lVar6 = 0;
    search_iters_accumulator.super_StatAccumulator._vptr_StatAccumulator =
         (_func_int **)&PTR__StatAccumulator_00117cb0;
    search_iters_accumulator.cumulative_log_error_ = 0.0;
    search_iters_accumulator.count_ = 0;
    shifts_accumulator.data_capacity_ = this->data_capacity_;
    shifts_accumulator.super_StatAccumulator._vptr_StatAccumulator =
         (_func_int **)&PTR__StatAccumulator_00117d60;
    shifts_accumulator.last_position_ = -1;
    shifts_accumulator.dense_region_start_idx_ = 0;
    shifts_accumulator.num_expected_shifts_._0_4_ = 0;
    shifts_accumulator.num_expected_shifts_._4_4_ = 0;
    shifts_accumulator.count_ = 0;
    Iterator<const_alex::AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>,_const_double,_const_std::pair<double,_double>_>
    ::Iterator(&it,this,0);
    iVar5 = 1;
    iVar7 = 0;
    iVar8 = -1;
    while( true ) {
      if ((long)it.cur_idx_ == -1) break;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (this->super_AlexNode<double,_double>).model_.a_;
      uVar3 = this->data_capacity_ - 1;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = (it.node_)->key_slots_[it.cur_idx_];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->super_AlexNode<double,_double>).model_.b_;
      auVar11 = vfmadd213sd_fma(auVar12,auVar10,auVar1);
      if ((int)auVar11._0_8_ <= (int)uVar3) {
        uVar3 = (int)auVar11._0_8_;
      }
      ExpectedSearchIterationsAccumulator::accumulate
                (&search_iters_accumulator,it.cur_idx_,~((int)uVar3 >> 0x1f) & uVar3);
      iVar2 = it.cur_idx_;
      if (iVar8 + 1 < it.cur_idx_) {
        lVar4 = (long)((iVar8 + 1) - iVar7);
        lVar6 = lVar6 + ((ulong)(lVar4 * lVar4) >> 2);
        shifts_accumulator.dense_region_start_idx_ = it.cur_idx_;
        iVar7 = it.cur_idx_;
        shifts_accumulator.num_expected_shifts_ = lVar6;
      }
      shifts_accumulator.last_position_ = it.cur_idx_;
      shifts_accumulator.count_ = iVar5;
      Iterator<const_alex::AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>,_const_double,_const_std::pair<double,_double>_>
      ::operator++(&it,0);
      iVar5 = iVar5 + 1;
      iVar8 = iVar2;
    }
    this->expected_avg_exp_search_iterations_ =
         (double)((ulong)(search_iters_accumulator.count_ != 0) *
                 (long)(search_iters_accumulator.cumulative_log_error_ /
                       (double)search_iters_accumulator.count_));
    dVar9 = ExpectedShiftsAccumulator::get_stat(&shifts_accumulator);
    this->expected_avg_shifts_ = dVar9;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = this->expected_avg_exp_search_iterations_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar9 * 0.5 * frac_inserts;
    auVar11 = vfmadd231sd_fma(auVar11,auVar13,ZEXT816(0x4034000000000000));
    return auVar11._0_8_;
  }
  return 0.0;
}

Assistant:

double compute_expected_cost(double frac_inserts = 0) {
    if (num_keys_ == 0) {
      return 0;
    }

    ExpectedSearchIterationsAccumulator search_iters_accumulator;
    ExpectedShiftsAccumulator shifts_accumulator(data_capacity_);
    const_iterator_type it(this, 0);
    for (; !it.is_end(); it++) {
      int predicted_position = std::max(
          0, std::min(data_capacity_ - 1, this->model_.predict(it.key())));
      search_iters_accumulator.accumulate(it.cur_idx_, predicted_position);
      shifts_accumulator.accumulate(it.cur_idx_, predicted_position);
    }
    expected_avg_exp_search_iterations_ = search_iters_accumulator.get_stat();
    expected_avg_shifts_ = shifts_accumulator.get_stat();
    double cost =
        kExpSearchIterationsWeight * expected_avg_exp_search_iterations_ +
        kShiftsWeight * expected_avg_shifts_ * frac_inserts;
    return cost;
  }